

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

int archeck(int p,double *ar)

{
  uint uVar1;
  int iVar2;
  double *coeff;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  int iVar3;
  ulong uVar4;
  undefined4 uVar5;
  
  uVar1 = p + 1;
  coeff = (double *)malloc((long)(int)uVar1 * 8);
  ZEROR = (double *)malloc((long)p * 8);
  ZEROI = (double *)malloc((long)p * 8);
  __ptr = malloc((long)(int)uVar1 << 2);
  *coeff = 1.0;
  if (0 < p) {
    uVar4 = 0;
    do {
      coeff[uVar4 + 1] = -ar[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)p != uVar4);
  }
  if (-1 < p) {
    uVar4 = 0;
    do {
      uVar5 = 0xffffffff;
      if (coeff[uVar4] != 0.0) {
        uVar5 = (int)uVar4;
      }
      if (NAN(coeff[uVar4])) {
        uVar5 = (int)uVar4;
      }
      *(undefined4 *)((long)__ptr + uVar4 * 4) = uVar5;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    if (-1 < p) {
      iVar3 = -1;
      uVar4 = 0;
      do {
        iVar2 = *(int *)((long)__ptr + uVar4 * 4);
        if (iVar2 < iVar3) {
          iVar2 = iVar3;
        }
        iVar3 = iVar2;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      if ((iVar3 != 0) && (polyroot(coeff,p,ZEROR,ZEROI), 0 < p)) {
        uVar4 = 0;
        do {
          if (SQRT(ZEROI[uVar4] * ZEROI[uVar4] + ZEROR[uVar4] * ZEROR[uVar4]) < 1.0) {
            free(coeff);
            free(ZEROR);
            free(ZEROI);
            free(__ptr);
            return 0;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)p != uVar4);
      }
      goto LAB_00131d66;
    }
  }
  polyroot(coeff,p,ZEROR,ZEROI);
LAB_00131d66:
  free(coeff);
  free(ZEROR);
  free(ZEROI);
  free(__ptr);
  return 1;
}

Assistant:

int archeck(int p, double *ar) {
	int check, N, i;
	double *coeff,*zeror,*zeroi,mod,wmaxv;
	int *which,wmax;

	N = p + 1;
	check = 1;

	coeff = (double*)malloc(sizeof(double)*N);
	zeror = (double*)malloc(sizeof(double)*p);
	zeroi = (double*)malloc(sizeof(double)*p);
	which = (int*)malloc(sizeof(int)*N);

	coeff[0] = 1.0;

	for(i = 0; i < p;++i) {
		coeff[i+1] = -ar[i];
	}

	for(i = 0; i < N;++i) {
		if (coeff[i] != 0) {
			which[i] = i;
		} else {
			which[i] = -1;
		}
	}

	wmax = -1;

	for(i = 0; i < N;++i) {
		if (wmax < which[i]) {
			wmax = which[i];
		}
	}

	if (!wmax){
		free(coeff);
		free(zeror);
		free(zeroi);
		free(which);
		return 1;
	}

	//polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI)

	polyroot(coeff,p,zeror,zeroi);

	for(i = 0; i < p;++i) {
		mod = sqrt(pow(zeror[i],2.0) + pow(zeroi[i],2));
		if (mod < 1.0) {
			free(coeff);
			free(zeror);
			free(zeroi);
			free(which);
			return 0;
		}
	}


	free(coeff);
	free(zeror);
	free(zeroi);
	free(which);
	return check;
}